

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

Attribute * attrsLookup(TidyDocImpl *doc,TidyAttribImpl *attribs,ctmbstr atnam)

{
  ctmbstr s2;
  uint uVar1;
  int iVar2;
  AttrHash *pAVar3;
  AttrHash **ppAVar4;
  Attribute *pAVar5;
  
  if (atnam != (ctmbstr)0x0) {
    uVar1 = attrsHash(atnam);
    ppAVar4 = attribs->hashtab + uVar1;
    while ((pAVar3 = *ppAVar4, pAVar3 != (AttrHash *)0x0 && (pAVar3->attr != (Attribute *)0x0))) {
      iVar2 = prvTidytmbstrcasecmp(atnam,pAVar3->attr->name);
      if (iVar2 == 0) {
        return pAVar3->attr;
      }
      ppAVar4 = &pAVar3->next;
    }
    for (pAVar5 = attribute_defs; s2 = pAVar5->name, s2 != (ctmbstr)0x0; pAVar5 = pAVar5 + 1) {
      iVar2 = prvTidytmbstrcasecmp(atnam,s2);
      if (iVar2 == 0) {
        pAVar3 = (AttrHash *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x10);
        pAVar3->attr = pAVar5;
        uVar1 = attrsHash(s2);
        pAVar3->next = attribs->hashtab[uVar1];
        attribs->hashtab[uVar1] = pAVar3;
        return pAVar5;
      }
    }
  }
  return (Attribute *)0x0;
}

Assistant:

static const Attribute* attrsLookup(TidyDocImpl* doc,
                               TidyAttribImpl* ARG_UNUSED(attribs),
                               ctmbstr atnam)
{
    const Attribute *np;
    const AttrHash *p;

    if (!atnam)
        return NULL;

    for (p = attribs->hashtab[attrsHash(atnam)]; p && p->attr; p = p->next)
        if (TY_(tmbstrcasecmp)(atnam, p->attr->name) == 0)
            return p->attr;

    for (np = attribute_defs; np && np->name; ++np)
        if (TY_(tmbstrcasecmp)(atnam, np->name) == 0)
            return attrsInstall(doc, attribs, np);

    return NULL;
}